

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLCoreCacheHandler.h
# Opt level: O1

void __thiscall
irr::video::
COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
::setBlendEquation(COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                   *this,GLenum mode)

{
  GLenum *pGVar1;
  code *pcVar2;
  ulong uVar3;
  
  if ((*this->BlendEquation != mode) || (this->BlendEquationInvalid == true)) {
    pcVar2 = *(code **)&this->Driver->field_0xac8;
    if ((pcVar2 != (code *)0x0) ||
       (pcVar2 = *(code **)&this->Driver->field_0xac0, pcVar2 != (code *)0x0)) {
      (*pcVar2)(mode);
    }
    if (this->FrameBufferCount != 0) {
      pGVar1 = this->BlendEquation;
      uVar3 = 0;
      do {
        pGVar1[uVar3] = mode;
        uVar3 = uVar3 + 1;
      } while (uVar3 < this->FrameBufferCount);
    }
    this->BlendEquationInvalid = false;
  }
  return;
}

Assistant:

void setBlendEquation(GLenum mode)
	{
		if (BlendEquation[0] != mode || BlendEquationInvalid) {
			Driver->irrGlBlendEquation(mode);

			for (GLuint i = 0; i < FrameBufferCount; ++i)
				BlendEquation[i] = mode;

			BlendEquationInvalid = false;
		}
	}